

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

void LowererMD::LegalizeSrc<false>(Instr *instr,Opnd *src,LegalForms forms)

{
  long lVar1;
  LegalForms LVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  OpCode assignOpcode;
  undefined4 *puVar6;
  Int64ConstOpnd *pIVar7;
  RegOpnd *dstOpnd;
  IntConstOpnd *this;
  MemRefOpnd *memRefOpnd;
  AddrOpnd *this_00;
  Instr *pIVar8;
  Opnd *pOVar9;
  AddrOpnd *largeConstOpnd;
  IndirOpnd *pIVar10;
  AddrOpndKind kind;
  char *message;
  char *error;
  uint lineNumber;
  Var address;
  Func *this_01;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x807,"(instr)","instr");
    if (!bVar4) goto LAB_005e57b8;
    *puVar6 = 0;
  }
  if (src == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x808,"(src)","src");
    if (!bVar4) goto LAB_005e57b8;
    *puVar6 = 0;
  }
  if ((instr->m_src1 != src) && (instr->m_src2 != src)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x809,"(src == instr->GetSrc1() || src == instr->GetSrc2())",
                       "src == instr->GetSrc1() || src == instr->GetSrc2()");
    if (!bVar4) goto LAB_005e57b8;
    *puVar6 = 0;
  }
  if (forms == L_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x80a,"(forms)","forms");
    if (!bVar4) goto LAB_005e57b8;
    *puVar6 = 0;
  }
  OVar5 = IR::Opnd::GetKind(src);
  switch(OVar5) {
  case OpndKindIntConst:
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    this = IR::Opnd::AsIntConstOpnd(src);
    if (TySize[(this->super_Opnd).m_type] == 8) {
      if ((instr->field_0x36 & 0x20) == 0) {
        lVar1 = (this->super_EncodableOpnd<long>).m_value;
        if ((int)lVar1 == lVar1) goto LAB_005e541d;
        if ((forms & L_Reg) == L_None) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x82f,"(forms & L_Reg)","forms & L_Reg");
          if (!bVar4) goto LAB_005e57b8;
          *puVar6 = 0;
        }
        pOVar9 = IR::Opnd::Copy(&this->super_Opnd,instr->m_func);
        largeConstOpnd = (AddrOpnd *)IR::Opnd::AsIntConstOpnd(pOVar9);
        this_01 = instr->m_func->topFunc;
        address = (Var)(this->super_EncodableOpnd<long>).m_value;
        kind = AddrOpndKindConstantAddress;
        goto LAB_005e570b;
      }
      break;
    }
LAB_005e541d:
    LVar2 = forms & L_Imm32;
    goto joined_r0x005e5453;
  case OpndKindInt64Const:
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    pIVar7 = IR::Opnd::AsInt64ConstOpnd(src);
    if ((forms & L_Imm32) != L_None) {
      if (TySize[src->m_type] != 8) {
        return;
      }
      if (((instr->field_0x36 & 0x20) == 0) &&
         (lVar1 = (pIVar7->super_EncodableOpnd<long>).m_value, (int)lVar1 == lVar1)) {
        return;
      }
    }
    if ((forms & L_Reg) == L_None) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x851,"(forms & L_Reg)","forms & L_Reg");
      if (!bVar4) goto LAB_005e57b8;
      *puVar6 = 0;
    }
    dstOpnd = IR::RegOpnd::New(src->m_type,instr->m_func);
    pIVar8 = IR::Instr::New(MOV,&dstOpnd->super_Opnd,src,instr->m_func);
    IR::Instr::InsertBefore(instr,pIVar8);
    IR::Instr::ReplaceSrc(instr,src,&dstOpnd->super_Opnd);
    return;
  case OpndKindFloatConst:
    break;
  default:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x899,"(false)","false");
    if (!bVar4) goto LAB_005e57b8;
    *puVar6 = 0;
    break;
  case OpndKindHelperCall:
  case OpndKindLabel:
    if ((instr->field_0x36 & 0x20) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x894,"(!instr->isInlineeEntryInstr)","!instr->isInlineeEntryInstr");
      if (!bVar4) goto LAB_005e57b8;
      *puVar6 = 0;
    }
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    error = "(forms & L_Ptr)";
    message = "forms & L_Ptr";
    lineNumber = 0x895;
    goto LAB_005e5376;
  case OpndKindSym:
  case OpndKindIndir:
    goto switchD_005e51c2_caseD_7;
  case OpndKindReg:
    if ((forms & L_Reg) != L_None) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    error = "(forms & L_Reg)";
    message = "forms & L_Reg";
    lineNumber = 0x811;
LAB_005e5376:
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,lineNumber,error,message);
    if (bVar4) {
      *puVar6 = 0;
      return;
    }
    goto LAB_005e57b8;
  case OpndKindAddr:
    if ((forms & L_Ptr) != L_None) {
      return;
    }
    this_00 = IR::Opnd::AsAddrOpnd(src);
    if ((forms & L_Imm32) == L_None) {
      if ((instr->field_0x36 & 0x20) != 0) {
LAB_005e562e:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                           ,0x86e,"(!instr->isInlineeEntryInstr)","!instr->isInlineeEntryInstr");
        if (!bVar4) goto LAB_005e57b8;
        *puVar6 = 0;
      }
    }
    else {
      if (TySize[(this_00->super_Opnd).m_type] != 8) {
        return;
      }
      if ((instr->field_0x36 & 0x20) != 0) goto LAB_005e562e;
      if ((Var)(long)(int)this_00->m_address == this_00->m_address) {
        return;
      }
    }
    if ((forms & L_Reg) == L_None) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x86f,"(forms & L_Reg)","forms & L_Reg");
      if (!bVar4) goto LAB_005e57b8;
      *puVar6 = 0;
    }
    pOVar9 = IR::Opnd::Copy(&this_00->super_Opnd,instr->m_func);
    largeConstOpnd = IR::Opnd::AsAddrOpnd(pOVar9);
    this_01 = instr->m_func->topFunc;
    address = this_00->m_address;
    kind = this_00->addrOpndKind;
LAB_005e570b:
    pIVar10 = Func::GetConstantAddressIndirOpnd
                        (this_01,(intptr_t)address,&largeConstOpnd->super_Opnd,kind,TyUint64,MOV);
    bVar4 = HoistLargeConstant(pIVar10,src,instr);
    if (bVar4) {
      return;
    }
    break;
  case OpndKindMemRef:
    memRefOpnd = IR::Opnd::AsMemRefOpnd(src);
    if ((long)(int)memRefOpnd->m_memLoc != memRefOpnd->m_memLoc) {
      src = &IR::Instr::HoistMemRefAddress(instr,memRefOpnd,MOV)->super_Opnd;
    }
    goto switchD_005e51c2_caseD_7;
  }
switchD_005e51c2_caseD_3:
  if ((forms & L_Reg) == L_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x8a4,"(forms & L_Reg)","forms & L_Reg");
    if (!bVar4) goto LAB_005e57b8;
    *puVar6 = 0;
  }
  if ((instr->m_dst != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsEqual(instr->m_dst,src), bVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x8a5,"(!(instr->GetDst() && instr->GetDst()->IsEqual(src)))",
                       "!(instr->GetDst() && instr->GetDst()->IsEqual(src))");
    if (!bVar4) {
LAB_005e57b8:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  assignOpcode = LowererMDArch::GetAssignOp((((IndirOpnd *)src)->super_Opnd).m_type);
  pIVar10 = (IndirOpnd *)instr->m_src2;
  if ((IndirOpnd *)src != pIVar10) {
    if (pIVar10 == (IndirOpnd *)0x0) {
      bVar4 = false;
    }
    else {
      bVar4 = IR::Opnd::IsEqual(src,(Opnd *)pIVar10);
    }
    pIVar8 = IR::Instr::HoistSrc1(instr,assignOpcode,RegNOREG,(StackSym *)0x0);
    if (bVar4 != false) {
      IR::Instr::ReplaceSrc2(instr,pIVar8->m_dst);
    }
    *(ushort *)&pIVar8->field_0x36 =
         *(ushort *)&pIVar8->field_0x36 & 0xffdf | *(ushort *)&instr->field_0x36 & 0x20;
    instr->field_0x36 = instr->field_0x36 & 0xdf;
    return;
  }
  IR::Instr::HoistSrc2(instr,assignOpcode,RegNOREG,(StackSym *)0x0);
  return;
switchD_005e51c2_caseD_7:
  LVar2 = forms & L_Mem;
joined_r0x005e5453:
  if (LVar2 != L_None) {
    return;
  }
  goto switchD_005e51c2_caseD_3;
}

Assistant:

void LowererMD::LegalizeSrc(IR::Instr *const instr, IR::Opnd *src, const LegalForms forms)
{
    Assert(instr);
    Assert(src);
    Assert(src == instr->GetSrc1() || src == instr->GetSrc2());
    Assert(forms);
#ifndef _M_X64
    AssertMsg(!src->IsInt64() || src->IsMemoryOpnd(), "Int64 supported only on x64");
#endif
    switch(src->GetKind())
    {
        case IR::OpndKindReg:
            Assert(forms & L_Reg);
            return;

        case IR::OpndKindIntConst:
            if(forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::IntConstOpnd * intOpnd = src->AsIntConstOpnd();
                if ((TySize[intOpnd->GetType()] != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord(intOpnd->GetValue())))
                {
                    if (forms & L_Imm32)
                    {
                        // the constant fits in 32-bit, no need to hoist
                        return;
                    }
                    break;
                }
                if (verify)
                {
                    AssertMsg(false, "IntConstOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }
                // The actual value for inlinee entry instr isn't determined until encoder
                // So it need to be hoisted conventionally.
                if (!instr->isInlineeEntryInstr)
                {
                    Assert(forms & L_Reg);
                    IR::IntConstOpnd * newIntOpnd = intOpnd->Copy(instr->m_func)->AsIntConstOpnd();
                    IR::IndirOpnd * indirOpnd = instr->m_func->GetTopFunc()->GetConstantAddressIndirOpnd(intOpnd->GetValue(), newIntOpnd, IR::AddrOpndKindConstantAddress, TyMachPtr, Js::OpCode::MOV);
                    if (HoistLargeConstant(indirOpnd, src, instr))
                    {
                        return;
                    }
                }
            }
#endif
            break;
        case IR::OpndKindFloatConst:
            break; // assume for now that it always needs to be hoisted

        case IR::OpndKindInt64Const:
            if (forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::Int64ConstOpnd * int64Opnd = src->AsInt64ConstOpnd();
                if ((forms & L_Imm32) && ((src->GetSize() != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord(int64Opnd->GetValue()))))
                {
                    // the immediate fits in 32-bit, no need to hoist
                    return;
                }
                if (verify)
                {
                    AssertMsg(false, "Int64ConstOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }

                Assert(forms & L_Reg);
                IR::Opnd* regOpnd = IR::RegOpnd::New(src->GetType(), instr->m_func);
                IR::Instr* moveToReg = IR::Instr::New(Js::OpCode::MOV, regOpnd, src, instr->m_func);
                instr->InsertBefore(moveToReg);
                instr->ReplaceSrc(src, regOpnd);
                return;
            }
#endif
            break;
        case IR::OpndKindAddr:
            if (forms & L_Ptr)
            {
                return;
            }
#ifdef _M_X64
            {
                IR::AddrOpnd * addrOpnd = src->AsAddrOpnd();
                if ((forms & L_Imm32) && ((TySize[addrOpnd->GetType()] != 8) ||
                    (!instr->isInlineeEntryInstr && Math::FitsInDWord((size_t)addrOpnd->m_address))))
                {
                    // the address fits in 32-bit, no need to hoist
                    return;
                }
                if (verify)
                {
                    AssertMsg(false, "AddrOpnd doesn't fit in 32 bits. Missing legalization");
                    return;
                }

                Assert(!instr->isInlineeEntryInstr);
                Assert(forms & L_Reg);
                // TODO: michhol, remove cast after making m_address intptr
                IR::AddrOpnd * newAddrOpnd = addrOpnd->Copy(instr->m_func)->AsAddrOpnd();
                IR::IndirOpnd * indirOpnd = instr->m_func->GetTopFunc()->GetConstantAddressIndirOpnd((intptr_t)addrOpnd->m_address, newAddrOpnd, addrOpnd->GetAddrOpndKind(), TyMachPtr, Js::OpCode::MOV);
                if (HoistLargeConstant(indirOpnd, src, instr))
                {
                    return;
                }
            }
#endif
            break;

        case IR::OpndKindMemRef:
        {
            IR::MemRefOpnd *const memRefOpnd = src->AsMemRefOpnd();
            if(!LowererMDArch::IsLegalMemLoc(memRefOpnd))
            {
                if (verify)
                {
                    AssertMsg(false, "Memory reference not legal in src opnd. Missing legalization");
                    return;
                }
                src = instr->HoistMemRefAddress(memRefOpnd, Js::OpCode::MOV);
            }
            // fall through
        }

        case IR::OpndKindSym:
        case IR::OpndKindIndir:
            if(forms & L_Mem)
            {
                return;
            }
            break;

        case IR::OpndKindHelperCall:
        case IR::OpndKindLabel:
            Assert(!instr->isInlineeEntryInstr);
            Assert(forms & L_Ptr);
            return;

        default:
            Assert(false);
            __assume(false);
    }

    if (verify)
    {
        AssertMsg(false, "Src opnd not legal. Missing legalization");
        return;
    }

    // Hoist the src into a reg
    Assert(forms & L_Reg);
    Assert(!(instr->GetDst() && instr->GetDst()->IsEqual(src)));
    const Js::OpCode loadOpCode = GetLoadOp(src->GetType());
    if(src == instr->GetSrc2())
    {
        instr->HoistSrc2(loadOpCode);
        return;
    }
    const bool equalsSrc2 = instr->GetSrc2() && src->IsEqual(instr->GetSrc2());
    IR::Instr * hoistInstr = instr->HoistSrc1(loadOpCode);
    if(equalsSrc2)
    {
        instr->ReplaceSrc2(hoistInstr->GetDst());
    }
    hoistInstr->isInlineeEntryInstr = instr->isInlineeEntryInstr;
    instr->isInlineeEntryInstr = false;
}